

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O2

void Acec_TreePhases_rec(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vMap,int Node,int fPhase,
                        Vec_Bit_t *vVisit)

{
  int i;
  int iVar1;
  int iVar2;
  uint v;
  int Node_00;
  uint uVar3;
  uint local_54;
  
  if (Node == 0) {
    __assert_fail("Node != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecTree.c"
                  ,0x188,
                  "void Acec_TreePhases_rec(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, Vec_Bit_t *)"
                 );
  }
  i = Vec_IntEntry(vMap,Node);
  if (i != -1) {
    iVar1 = i * 6;
    iVar2 = Vec_IntEntry(vAdds,iVar1 + 4);
    if (iVar2 != Node) {
      __assert_fail("Node == Vec_IntEntry( vAdds, 6*iBox+4 )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecTree.c"
                    ,0x18c,
                    "void Acec_TreePhases_rec(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, Vec_Bit_t *)"
                   );
    }
    iVar2 = Vec_BitEntry(vVisit,i);
    if (iVar2 == 0) {
      Vec_BitWriteEntry(vVisit,i,1);
      Vec_IntEntry(vAdds,iVar1 + 3);
      v = Acec_SignBit(vAdds,i,3);
      iVar2 = Vec_IntEntry(vAdds,iVar1 + 2);
      local_54 = fPhase;
      if (iVar2 == 0) {
        local_54 = Acec_SignBit(vAdds,i,2);
        local_54 = fPhase ^ local_54;
        v = v ^ local_54;
        Acec_SignSetBit2(vAdds,i,2,local_54);
      }
      for (iVar2 = 0; iVar2 != 3; iVar2 = iVar2 + 1) {
        Node_00 = Vec_IntEntry(vAdds,iVar1 + iVar2);
        if (Node_00 != 0) {
          uVar3 = Acec_SignBit(vAdds,i,iVar2);
          uVar3 = uVar3 ^ local_54;
          v = v ^ uVar3;
          Acec_TreePhases_rec(p,vAdds,vMap,Node_00,uVar3,vVisit);
          Acec_SignSetBit2(vAdds,i,iVar2,uVar3);
        }
      }
      Acec_SignSetBit2(vAdds,i,3,v);
      Acec_SignSetBit2(vAdds,i,4,local_54);
      return;
    }
  }
  return;
}

Assistant:

void Acec_TreePhases_rec( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vMap, int Node, int fPhase, Vec_Bit_t * vVisit )
{
    int k, iBox, iXor, fXorPhase, fPhaseThis;
    assert( Node != 0 );
    iBox = Vec_IntEntry( vMap, Node );
    if ( iBox == -1 )
        return;
    assert( Node == Vec_IntEntry( vAdds, 6*iBox+4 ) );
    if ( Vec_BitEntry(vVisit, iBox) )
        return;
    Vec_BitWriteEntry( vVisit, iBox, 1 );
    iXor = Vec_IntEntry( vAdds, 6*iBox+3 );
    fXorPhase = Acec_SignBit(vAdds, iBox, 3);
    if ( Vec_IntEntry(vAdds, 6*iBox+2) == 0 )
    {
        //fPhaseThis = Acec_SignBit( vAdds, iBox, 2 ) ^ fPhase;
        //fXorPhase ^= fPhaseThis;
        //Acec_SignSetBit2( vAdds, iBox, 2, fPhaseThis ); // complemented HADD -- create const1 input
        fPhase ^= Acec_SignBit( vAdds, iBox, 2 );
        fXorPhase ^= fPhase;
        Acec_SignSetBit2( vAdds, iBox, 2, fPhase ); // complemented HADD -- create const1 input
    }
    for ( k = 0; k < 3; k++ )
    {
        int iObj = Vec_IntEntry( vAdds, 6*iBox+k );
        if ( iObj == 0 )
            continue;
        fPhaseThis = Acec_SignBit(vAdds, iBox, k) ^ fPhase;
        fXorPhase ^= fPhaseThis;
        Acec_TreePhases_rec( p, vAdds, vMap, iObj, fPhaseThis, vVisit );
        Acec_SignSetBit2( vAdds, iBox, k, fPhaseThis );
    }
    Acec_SignSetBit2( vAdds, iBox, 3, fXorPhase );
    Acec_SignSetBit2( vAdds, iBox, 4, fPhase );
}